

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShiftRoll.hpp
# Opt level: O2

void InstructionSet::x86::Primitive::
     sar<unsigned_char,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (modify_t<unsigned_char> destination,uint8_t count,Context *context)

{
  byte bVar1;
  byte bVar2;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,count) != 0) {
    bVar1 = *destination;
    if (count < 8) {
      (context->flags).carry_ = 1 << (count - 1 & 0x1f) & (uint)bVar1;
      bVar2 = 0;
      if ((char)(bVar1 & 0xffffff80) != '\0') {
        bVar2 = (byte)(-0x100 >> (count & 0x1f));
      }
      *destination = bVar2 | *destination >> (count & 0x1f);
    }
    else {
      *destination = (char)bVar1 >> 7;
      (context->flags).carry_ = bVar1 & 0xffffff80;
    }
    (context->flags).overflow_ = 0;
    Flags::
    set_from<unsigned_char,(InstructionSet::x86::Flag)2,(InstructionSet::x86::Flag)7,(InstructionSet::x86::Flag)8>
              (&context->flags,*destination);
    return;
  }
  return;
}

Assistant:

void sar(
	modify_t<IntT> destination,
	uint8_t count,
	ContextT &context
) {
	if(!count) {
		return;
	}

	const IntT sign = Numeric::top_bit<IntT>() & destination;
	if(count >= Numeric::bit_size<IntT>()) {
		destination = sign ? IntT(~0) : IntT(0);
		context.flags.template set_from<Flag::Carry>(sign);
	} else {
		const auto mask = IntT(1 << (count - 1));
		context.flags.template set_from<Flag::Carry>(destination & mask);
		destination = (destination >> count) | (sign ? ~(IntT(~0) >> count) : 0);
	}
	context.flags.template set_from<Flag::Overflow>(0);
	context.flags.template set_from<IntT, Flag::Sign, Flag::Zero, Flag::ParityOdd>(destination);
}